

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeGetRequestedReserve(Btree *p)

{
  byte bVar1;
  BtShared *pBVar2;
  uint uVar3;
  
  sqlite3BtreeEnter(p);
  pBVar2 = p->pBt;
  bVar1 = pBVar2->nReserveWanted;
  uVar3 = pBVar2->pageSize - pBVar2->usableSize;
  sqlite3BtreeLeave(p);
  if ((int)uVar3 <= (int)(uint)bVar1) {
    uVar3 = (uint)bVar1;
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeGetRequestedReserve(Btree *p){
  int n1, n2;
  sqlite3BtreeEnter(p);
  n1 = (int)p->pBt->nReserveWanted;
  n2 = sqlite3BtreeGetReserveNoMutex(p);
  sqlite3BtreeLeave(p);
  return n1>n2 ? n1 : n2;
}